

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O2

void __thiscall burst::dynamic_tuple::reallocate(dynamic_tuple *this,size_t new_capacity)

{
  int8_t *destination;
  __array new_data;
  _Head_base<0UL,_signed_char_*,_false> local_20;
  
  if (this->m_volume <= new_capacity) {
    destination = (int8_t *)operator_new__(new_capacity);
    memset(destination,0,new_capacity);
    this->m_capacity = new_capacity;
    local_20._M_head_impl = destination;
    management::
    move<__gnu_cxx::__normal_iterator<burst::management::object_info_t*,std::vector<burst::management::object_info_t,std::allocator<burst::management::object_info_t>>>>
              ((this->m_objects).
               super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->m_objects).
               super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->m_data)._M_t.
               super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
               super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
               super__Head_base<0UL,_signed_char_*,_false>._M_head_impl,destination);
    local_20._M_head_impl =
         (this->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>
         ._M_t.super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
         super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
    (this->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t
    .super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
    super__Head_base<0UL,_signed_char_*,_false>._M_head_impl = destination;
    std::unique_ptr<signed_char[],_std::default_delete<signed_char[]>_>::~unique_ptr
              ((unique_ptr<signed_char[],_std::default_delete<signed_char[]>_> *)&local_20);
    return;
  }
  __assert_fail("new_capacity >= m_volume",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/dynamic_tuple.hpp"
                ,0x178,"void burst::dynamic_tuple::reallocate(std::size_t)");
}

Assistant:

void reallocate (std::size_t new_capacity)
        {
            assert(new_capacity >= m_volume);
            auto new_data = std::make_unique<std::int8_t[]>(new_capacity);
            m_capacity = new_capacity;

            management::move(m_objects.begin(), m_objects.end(), data(), new_data.get());
            std::swap(m_data, new_data);
        }